

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O0

void HUD_InitHud(void)

{
  bool bVar1;
  FTextureID local_13c;
  PClassInventory *pPStack_138;
  FTextureID tex_2;
  PClass *ti;
  FTextureID local_128;
  int local_124;
  FTextureID tex_1;
  FTextureID tex;
  undefined1 local_110 [8];
  FScanner sc;
  int lastlump;
  int lump;
  
  if ((gameinfo.gametype == GAME_Heretic) || (gameinfo.gametype == GAME_Hexen)) {
    healthpic = FTextureManager::FindTexture(&TexMan,"ARTIPTN2",8,1);
    HudFont = FFont::FindFont("HUDFONT_RAVEN");
  }
  else if (gameinfo.gametype == GAME_Strife) {
    healthpic = FTextureManager::FindTexture(&TexMan,"I_MDKT",8,1);
    HudFont = BigFont;
  }
  else {
    healthpic = FTextureManager::FindTexture(&TexMan,"MEDIA0",8,1);
    berserkpic = FTextureManager::FindTexture(&TexMan,"PSTRA0",8,1);
    HudFont = FFont::FindFont("HUDFONT_DOOM");
  }
  IndexFont = V_GetFont("INDEXFONT");
  if (HudFont == (FFont *)0x0) {
    HudFont = BigFont;
  }
  if (IndexFont == (FFont *)0x0) {
    IndexFont = ConFont;
  }
  invgems[0] = FTextureManager::FindTexture(&TexMan,"INVGEML1",8,1);
  invgems[1] = FTextureManager::FindTexture(&TexMan,"INVGEML2",8,1);
  invgems[2] = FTextureManager::FindTexture(&TexMan,"INVGEMR1",8,1);
  invgems[3] = FTextureManager::FindTexture(&TexMan,"INVGEMR2",8,1);
  fragpic = FTextureManager::FindTexture(&TexMan,"HU_FRAGS",8,1);
  TArray<PClassActor_*,_PClassActor_*>::Clear(&KeyTypes);
  TArray<PClassActor_*,_PClassActor_*>::Clear(&UnassignedKeyTypes);
  statspace = FFont::StringWidth(SmallFont,"Ac:");
  sc.LastGotLine = 0;
  while (sc._252_4_ = FWadCollection::FindLump(&Wads,"ALTHUDCF",&sc.LastGotLine,false),
        sc._252_4_ != -1) {
    FScanner::FScanner((FScanner *)local_110,sc._252_4_);
    while (bVar1 = FScanner::GetString((FScanner *)local_110), bVar1) {
      bVar1 = FScanner::Compare((FScanner *)local_110,"Health");
      if (bVar1) {
        FScanner::MustGetString((FScanner *)local_110);
        tex_1 = FTextureManager::CheckForTexture(&TexMan,(char *)local_110,8,1);
        bVar1 = FTextureID::isValid(&tex_1);
        if (bVar1) {
          local_124 = tex_1.texnum;
          healthpic = FTextureManager::operator[](&TexMan,tex_1);
        }
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)local_110,"Berserk");
        if (bVar1) {
          FScanner::MustGetString((FScanner *)local_110);
          local_128 = FTextureManager::CheckForTexture(&TexMan,(char *)local_110,8,1);
          bVar1 = FTextureID::isValid(&local_128);
          if (bVar1) {
            berserkpic = FTextureManager::operator[](&TexMan,local_128);
          }
        }
        else {
          pPStack_138 = (PClassInventory *)PClass::FindClass((char *)local_110);
          if (pPStack_138 == (PClassInventory *)0x0) {
            Printf("Unknown item class \'%s\' in ALTHUDCF\n",local_110);
          }
          else {
            bVar1 = PClass::IsDescendantOf
                              ((PClass *)pPStack_138,AInventory::RegistrationInfo.MyClass);
            if (!bVar1) {
              Printf("Invalid item class \'%s\' in ALTHUDCF\n",local_110);
              pPStack_138 = (PClassInventory *)0x0;
            }
          }
          FScanner::MustGetString((FScanner *)local_110);
          FTextureID::FTextureID(&local_13c);
          bVar1 = FScanner::Compare((FScanner *)local_110,"0");
          if (((bVar1) || (bVar1 = FScanner::Compare((FScanner *)local_110,"NULL"), bVar1)) ||
             (bVar1 = FScanner::Compare((FScanner *)local_110,""), bVar1)) {
            FTextureID::SetInvalid(&local_13c);
          }
          else {
            local_13c = FTextureManager::CheckForTexture(&TexMan,(char *)local_110,8,1);
          }
          if (pPStack_138 != (PClassInventory *)0x0) {
            SetHUDIcon(pPStack_138,local_13c);
          }
        }
      }
    }
    FScanner::~FScanner((FScanner *)local_110);
  }
  return;
}

Assistant:

void HUD_InitHud()
{
	switch (gameinfo.gametype)
	{
	case GAME_Heretic:
	case GAME_Hexen:
		healthpic = TexMan.FindTexture("ARTIPTN2");
		HudFont=FFont::FindFont("HUDFONT_RAVEN");
		break;

	case GAME_Strife:
		healthpic = TexMan.FindTexture("I_MDKT");
		HudFont=BigFont;	// Strife doesn't have anything nice so use the standard font
		break;

	default:
		healthpic = TexMan.FindTexture("MEDIA0");
		berserkpic = TexMan.FindTexture("PSTRA0");
		HudFont=FFont::FindFont("HUDFONT_DOOM");
		break;
	}

	IndexFont = V_GetFont("INDEXFONT");

	if (HudFont == NULL) HudFont = BigFont;
	if (IndexFont == NULL) IndexFont = ConFont;	// Emergency fallback

	invgems[0] = TexMan.FindTexture("INVGEML1");
	invgems[1] = TexMan.FindTexture("INVGEML2");
	invgems[2] = TexMan.FindTexture("INVGEMR1");
	invgems[3] = TexMan.FindTexture("INVGEMR2");

	fragpic = TexMan.FindTexture("HU_FRAGS");	// Sadly, I don't have anything usable for this. :(

	KeyTypes.Clear();
	UnassignedKeyTypes.Clear();

	statspace = SmallFont->StringWidth("Ac:");



	// Now read custom icon overrides
	int lump, lastlump = 0;

	while ((lump = Wads.FindLump ("ALTHUDCF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		while (sc.GetString())
		{
			if (sc.Compare("Health"))
			{
				sc.MustGetString();
				FTextureID tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				if (tex.isValid()) healthpic = TexMan[tex];
			}
			else if (sc.Compare("Berserk"))
			{
				sc.MustGetString();
				FTextureID tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				if (tex.isValid()) berserkpic = TexMan[tex];
			}
			else
			{
				PClass *ti = PClass::FindClass(sc.String);
				if (!ti)
				{
					Printf("Unknown item class '%s' in ALTHUDCF\n", sc.String);
				}
				else if (!ti->IsDescendantOf(RUNTIME_CLASS(AInventory)))
				{
					Printf("Invalid item class '%s' in ALTHUDCF\n", sc.String);
					ti=NULL;
				}
				sc.MustGetString();
				FTextureID tex;

				if (!sc.Compare("0") && !sc.Compare("NULL") && !sc.Compare(""))
				{
					tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				}
				else tex.SetInvalid();

				if (ti) SetHUDIcon(static_cast<PClassInventory*>(ti), tex);
			}
		}
	}
}